

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewRandomAccessFile
          (PosixEnv *this,string *filename,RandomAccessFile **result)

{
  bool bVar1;
  char *__file;
  void *pvVar2;
  undefined8 *in_RCX;
  string *in_RDX;
  PosixRandomAccessFile *in_RSI;
  PosixMmapReadableFile *in_RDI;
  void *mmap_base;
  uint64_t file_size;
  int fd;
  Status *status;
  Status *in_stack_ffffffffffffff38;
  Limiter *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  int fd_00;
  PosixMmapReadableFile *filename_00;
  string local_80 [4];
  int in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  size_t local_50;
  string local_48 [36];
  int local_24;
  undefined8 *local_20;
  string *local_18;
  
  *in_RCX = 0;
  filename_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  __file = (char *)std::__cxx11::string::c_str();
  local_24 = open(__file,0x80000);
  if (local_24 < 0) {
    __errno_location();
    PosixError(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  }
  else {
    bVar1 = Limiter::Acquire((Limiter *)(in_RSI + 5));
    if (bVar1) {
      (*(in_RSI->super_RandomAccessFile)._vptr_RandomAccessFile[0xb])
                (in_RDI,in_RSI,local_18,&local_50);
      bVar1 = Status::ok((Status *)in_RDI);
      if (bVar1) {
        pvVar2 = mmap((void *)0x0,local_50,1,1,local_24,0);
        if (pvVar2 == (void *)0xffffffffffffffff) {
          __errno_location();
          PosixError(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
          Status::operator=((Status *)local_18,in_stack_ffffffffffffff38);
          Status::~Status((Status *)local_18);
        }
        else {
          pvVar2 = operator_new(0x40);
          std::__cxx11::string::string(local_80,local_18);
          PosixMmapReadableFile::PosixMmapReadableFile
                    (in_RDI,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(size_t)pvVar2,
                     in_stack_ffffffffffffff40);
          *local_20 = pvVar2;
          std::__cxx11::string::~string(local_80);
        }
      }
      close(local_24);
      bVar1 = Status::ok((Status *)in_RDI);
      if (!bVar1) {
        Limiter::Release((Limiter *)(in_RSI + 5));
      }
    }
    else {
      pvVar2 = operator_new(0x38);
      fd_00 = (int)((ulong)in_RDI >> 0x20);
      std::__cxx11::string::string(local_48,local_18);
      PosixRandomAccessFile::PosixRandomAccessFile
                (in_RSI,(string *)filename_00,fd_00,(Limiter *)in_stack_ffffffffffffff58);
      *local_20 = pvVar2;
      std::__cxx11::string::~string(local_48);
      Status::OK();
    }
  }
  return (Status)(char *)filename_00;
}

Assistant:

Status NewRandomAccessFile(const std::string& filename,
                             RandomAccessFile** result) override {
    *result = nullptr;
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!mmap_limiter_.Acquire()) {
      *result = new PosixRandomAccessFile(filename, fd, &fd_limiter_);
      return Status::OK();
    }

    uint64_t file_size;
    Status status = GetFileSize(filename, &file_size);
    if (status.ok()) {
      void* mmap_base =
          ::mmap(/*addr=*/nullptr, file_size, PROT_READ, MAP_SHARED, fd, 0);
      if (mmap_base != MAP_FAILED) {
        *result = new PosixMmapReadableFile(filename,
                                            reinterpret_cast<char*>(mmap_base),
                                            file_size, &mmap_limiter_);
      } else {
        status = PosixError(filename, errno);
      }
    }
    ::close(fd);
    if (!status.ok()) {
      mmap_limiter_.Release();
    }
    return status;
  }